

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Table> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
          (RefPtr<wabt::interp::Table> *__return_storage_ptr__,Store *this,Store *args,
          TableType *args_1)

{
  Table *pTVar1;
  Index index;
  TableType local_68;
  Table *local_38;
  Ref local_30;
  Ref ref;
  TableType *args_local_1;
  Store *args_local;
  Store *this_local;
  RefPtr<wabt::interp::Table> *ptr;
  
  ref.index = (size_t)args_1;
  pTVar1 = (Table *)operator_new(0x88);
  TableType::TableType(&local_68,(TableType *)ref.index);
  Table::Table(pTVar1,args,&local_68);
  local_38 = pTVar1;
  index = FreeList<wabt::interp::Object*>::New<wabt::interp::Table*>
                    ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_38);
  Ref::Ref(&local_30,index);
  TableType::~TableType(&local_68);
  RefPtr<wabt::interp::Table>::RefPtr(__return_storage_ptr__,this,local_30);
  pTVar1 = RefPtr<wabt::interp::Table>::operator->(__return_storage_ptr__);
  (pTVar1->super_Extern).super_Object.self_.index = local_30.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}